

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O0

bool __thiscall bssl::der::ParseBmpString(der *this,Input in,string *out)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  cbb_st *pcVar4;
  uint8_t *puVar5;
  uint32_t local_7c [2];
  uint32_t c;
  undefined1 local_68 [8];
  ScopedCBB cbb;
  CBS cbs;
  string *out_local;
  Input in_local;
  
  in_local.data_.data_ = in.data_.data_;
  out_local = (string *)this;
  sVar2 = Input::size((Input *)&out_local);
  if ((sVar2 & 1) == 0) {
    puVar3 = Input::data((Input *)&out_local);
    sVar2 = Input::size((Input *)&out_local);
    CBS_init((CBS *)((long)&cbb.ctx_.u + 0x18),puVar3,sVar2);
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_68);
    pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_68);
    sVar2 = Input::size((Input *)&out_local);
    iVar1 = CBB_init(pcVar4,sVar2);
    if (iVar1 == 0) {
      in_local.data_.size_._7_1_ = 0;
    }
    else {
      do {
        sVar2 = CBS_len((CBS *)((long)&cbb.ctx_.u + 0x18));
        if (sVar2 == 0) {
          pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_68);
          puVar3 = CBB_data(pcVar4);
          pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_68);
          puVar5 = CBB_data(pcVar4);
          pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_68);
          sVar2 = CBB_len(pcVar4);
          ::std::__cxx11::string::assign<unsigned_char_const*,void>
                    ((string *)in.data_.size_,puVar3,puVar5 + sVar2);
          in_local.data_.size_._7_1_ = 1;
          goto LAB_005f1c55;
        }
        iVar1 = CBS_get_ucs2_be((CBS *)((long)&cbb.ctx_.u + 0x18),local_7c);
        if (iVar1 == 0) break;
        pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_68);
        iVar1 = CBB_add_utf8(pcVar4,local_7c[0]);
      } while (iVar1 != 0);
      in_local.data_.size_._7_1_ = 0;
    }
LAB_005f1c55:
    local_7c[1] = 1;
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_68);
  }
  else {
    in_local.data_.size_._7_1_ = 0;
  }
  return (bool)(in_local.data_.size_._7_1_ & 1);
}

Assistant:

bool ParseBmpString(Input in, std::string *out) {
  if (in.size() % 2 != 0) {
    return false;
  }

  CBS cbs;
  CBS_init(&cbs, in.data(), in.size());
  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), in.size())) {
    return false;
  }

  while (CBS_len(&cbs) != 0) {
    uint32_t c;
    if (!CBS_get_ucs2_be(&cbs, &c) ||  //
        !CBB_add_utf8(cbb.get(), c)) {
      return false;
    }
  }

  out->assign(CBB_data(cbb.get()), CBB_data(cbb.get()) + CBB_len(cbb.get()));
  return true;
}